

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_resampler.cc
# Opt level: O0

void webrtc::WebRtcAec_ResampleLinear
               (void *resampInst,float *inspeech,size_t size,float skew,float *outspeech,
               size_t *size_out)

{
  float fVar1;
  float fVar2;
  float local_a0;
  float local_98;
  float local_8c;
  float local_70;
  ulong local_60;
  size_t mm;
  size_t tn;
  float tnew;
  float be;
  float *y;
  AecResampler *obj;
  size_t *size_out_local;
  float *outspeech_local;
  float skew_local;
  size_t size_local;
  float *inspeech_local;
  void *resampInst_local;
  
  if (0xa0 < size) {
    __assert_fail("size <= 2 * FRAME_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4d,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (resampInst == (void *)0x0) {
    __assert_fail("resampInst != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4e,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (inspeech == (float *)0x0) {
    __assert_fail("inspeech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4f,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (outspeech == (float *)0x0) {
    __assert_fail("outspeech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x50,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (size_out == (size_t *)0x0) {
    __assert_fail("size_out != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x51,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  memcpy((void *)((long)resampInst + 0x144),inspeech,size << 2);
  fVar2 = skew + 1.0;
  local_60 = 0;
  tn._0_4_ = fVar2 * 0.0 + *(float *)((long)resampInst + 0x500);
  mm = (long)(float)tn | (long)((float)tn - 9.223372e+18) & (long)(float)tn >> 0x3f;
  while (mm < size) {
    local_70 = (float)mm;
    fVar1 = *(float *)((long)resampInst + mm * 4 + 0x140);
    outspeech[local_60] =
         ((float)tn - local_70) * (*(float *)((long)resampInst + mm * 4 + 0x144) - fVar1) + fVar1;
    local_60 = local_60 + 1;
    local_8c = (float)local_60;
    tn._0_4_ = fVar2 * local_8c + *(float *)((long)resampInst + 0x500);
    mm = (size_t)(int)(float)tn;
  }
  *size_out = local_60;
  local_98 = (float)*size_out;
  local_a0 = (float)size;
  *(float *)((long)resampInst + 0x500) =
       local_98 * fVar2 + -local_a0 + *(float *)((long)resampInst + 0x500);
  memmove(resampInst,(void *)((long)resampInst + size * 4),(0x140 - size) * 4);
  return;
}

Assistant:

void WebRtcAec_ResampleLinear(void* resampInst,
                              const float* inspeech,
                              size_t size,
                              float skew,
                              float* outspeech,
                              size_t* size_out) {
  AecResampler* obj = static_cast<AecResampler*>(resampInst);

  float* y;
  float be, tnew;
  size_t tn, mm;

  assert(size <= 2 * FRAME_LEN);
  assert(resampInst != NULL);
  assert(inspeech != NULL);
  assert(outspeech != NULL);
  assert(size_out != NULL);

  // Add new frame data in lookahead
  memcpy(&obj->buffer[FRAME_LEN + kResamplingDelay], inspeech,
         size * sizeof(inspeech[0]));

  // Sample rate ratio
  be = 1 + skew;

  // Loop over input frame
  mm = 0;
  y = &obj->buffer[FRAME_LEN];  // Point at current frame

  tnew = be * mm + obj->position;
  tn = (size_t)tnew;

  while (tn < size) {
    // Interpolation
    outspeech[mm] = y[tn] + (tnew - tn) * (y[tn + 1] - y[tn]);
    mm++;

    tnew = be * mm + obj->position;
    tn = static_cast<int>(tnew);
  }

  *size_out = mm;
  obj->position += (*size_out) * be - size;

  // Shift buffer
  memmove(obj->buffer, &obj->buffer[size],
          (kResamplerBufferSize - size) * sizeof(obj->buffer[0]));
}